

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

double __thiscall
helics::RandomDelayFilterOperation::getProperty
          (RandomDelayFilterOperation *this,string_view property)

{
  int iVar1;
  long lVar2;
  int *__s1;
  size_t __n;
  char *__s2;
  size_type __rlen;
  double dVar3;
  
  __s1 = (int *)property._M_str;
  __n = property._M_len;
  dVar3 = -1e+49;
  switch(__n) {
  case 3:
    iVar1 = bcmp(__s1,"min",__n);
    if (iVar1 == 0) break;
    __s2 = "max";
LAB_0022216b:
    iVar1 = bcmp(__s1,__s2,__n);
    if (iVar1 != 0) {
      return -1e+49;
    }
    lVar2 = 0x10;
    goto LAB_0022218e;
  case 4:
    iVar1 = bcmp(__s1,"mean",__n);
    if (iVar1 != 0) {
      __s2 = "beta";
      goto LAB_0022216b;
    }
    break;
  case 5:
    iVar1 = bcmp(__s1,"alpha",__n);
    if (iVar1 != 0) {
      return -1e+49;
    }
    break;
  case 6:
    if ((short)__s1[1] != 0x316d || *__s1 != 0x61726170) {
      iVar1 = bcmp(__s1,"param2",__n);
      lVar2 = 0x10;
      if ((iVar1 != 0) && ((short)__s1[1] != 0x7665 || *__s1 != 0x64647473)) {
        return -1e+49;
      }
      goto LAB_0022218e;
    }
    break;
  default:
    goto switchD_002220ac_default;
  }
  lVar2 = 8;
LAB_0022218e:
  dVar3 = *(double *)
           ((long)&(((this->rdelayGen)._M_t.
                     super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
                     .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->
                   dist)._M_i + lVar2);
switchD_002220ac_default:
  return dVar3;
}

Assistant:

double RandomDelayFilterOperation::getProperty(std::string_view property)
{
    if ((property == "param1") || (property == "mean") || (property == "min") ||
        (property == "alpha")) {
        return (rdelayGen->param1.load());
    }
    if ((property == "param2") || (property == "stddev") || (property == "max") ||
        (property == "beta")) {
        return (rdelayGen->param2.load());
    }
    return FilterOperations::getProperty(property);
}